

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O2

void __thiscall
tf::
ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
::_resolve_token_dependencies
          (ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
           *this,Pipeflow *pf)

{
  key_type *pkVar1;
  iterator __it;
  iterator __it_00;
  key_type *pkVar2;
  size_t target;
  key_type local_38;
  
  __it = std::
         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(this->_token_dependencies)._M_h,&pf->_token);
  if (__it.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    pkVar1 = *(key_type **)
              ((long)__it.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                     ._M_cur + 0x18);
    for (pkVar2 = *(key_type **)
                   ((long)__it.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                          ._M_cur + 0x10); pkVar2 != pkVar1; pkVar2 = pkVar2 + 1) {
      local_38 = *pkVar2;
      __it_00 = std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->_deferred_tokens)._M_h,&local_38);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)((long)__it_00.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_false>
                           ._M_cur + 0x20),&pf->_token);
      if (*(long *)((long)__it_00.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_false>
                          ._M_cur + 0x38) == 0) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long&,unsigned_long&>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&this->_ready_tokens,
                   (unsigned_long *)
                   ((long)__it_00.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_false>
                          ._M_cur + 0x10),
                   (unsigned_long *)
                   ((long)__it_00.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_false>
                          ._M_cur + 0x18));
        std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase(&(this->_deferred_tokens)._M_h,
                (const_iterator)
                __it_00.
                super__Node_iterator_base<std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_false>
                ._M_cur);
      }
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->_token_dependencies)._M_h,
            (const_iterator)
            __it.
            super__Node_iterator_base<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
            ._M_cur);
  }
  return;
}

Assistant:

void ScalablePipeline<P>::_resolve_token_dependencies(Pipeflow& pf) {

  if (auto it = _token_dependencies.find(pf._token);
      it != _token_dependencies.end()) {
    
    // iterate tokens that defer to pf._token
    for(size_t target : it->second) {

      auto dpf = _deferred_tokens.find(target);

      assert(dpf != _deferred_tokens.end());

      // erase pf._token from target's _dependents
      dpf->second._dependents.erase(pf._token);
      
      // target has no dependents
      if (dpf->second._dependents.empty()) {
        _ready_tokens.emplace(dpf->second._token, dpf->second._num_deferrals);
        _deferred_tokens.erase(dpf);
      }
    }

    _token_dependencies.erase(it);
  }
}